

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompileType<short>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> s;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1a;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  undefined2 local_16;
  Foo local_14;
  
  local_16 = 0;
  local_14 = Foo1;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<Foo>
            (&local_18,&local_14);
  local_1a.m_int = 0;
  CompiledMixedType<short,char>();
  CompiledMixedType<short,signed_char>();
  CompiledMixedType<short,unsigned_char>();
  CompiledMixedType<short,short>();
  CompiledMixedType<short,unsigned_short>();
  CompiledMixedType<short,int>();
  CompiledMixedType<short,unsigned_int>();
  CompiledMixedType<short,long>();
  CompiledMixedType<short,unsigned_long>();
  CompiledMixedType<short,long_long>();
  CompiledMixedType<short,unsigned_long_long>();
  ModulusFriendTest<short,char>();
  ModulusFriendTest<short,signed_char>();
  ModulusFriendTest<short,unsigned_char>();
  ModulusFriendTest<short,short>();
  ModulusFriendTest<short,unsigned_short>();
  ModulusFriendTest<short,int>();
  ModulusFriendTest<short,unsigned_int>();
  ModulusFriendTest<short,long>();
  ModulusFriendTest<short,unsigned_long>();
  ModulusFriendTest<short,long_long>();
  ModulusFriendTest<short,unsigned_long_long>();
  SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_16);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++(&local_1a,0);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++(&local_1a);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--(&local_1a,0);
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator--(&local_1a);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}